

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  char *__lhs;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Colour colour;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam00000000001b2630 = 0x7e7e7e7e7e7e7e;
    uRam00000000001b2637 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001b2620 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b2628 = 0x7e7e7e7e7e7e7e;
    DAT_001b262f = 0x7e;
    _DAT_001b2610 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b2618 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001b2600 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b2608 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b25f8 = 0x7e7e7e7e7e7e7e7e;
    DAT_001b263f = 0;
  }
  poVar3 = std::operator<<(poVar3,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar3,"\n");
  colour.m_moved = false;
  Colour::use(FileName);
  poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar3 = std::operator<<(poVar3," is a Catch v");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,".");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," b");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  __lhs = DAT_001b2558;
  std::__cxx11::string::string((string *)&local_38,"master",&local_39);
  bVar1 = std::operator!=(__lhs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar3 = std::operator<<(poVar3,DAT_001b2558);
    std::operator<<(poVar3,")");
  }
  poVar3 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar3,"Run with -? for options\n\n");
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar2 != 0) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n\n");
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }